

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

JavascriptArray *
Js::JavascriptOperators::GetOwnPropertyKeys(Var instance,ScriptContext *scriptContext)

{
  bool bVar1;
  RecyclableObject *object;
  JavascriptProxy *this;
  JavascriptArray *pJVar2;
  
  object = ToObject(instance,scriptContext);
  bVar1 = VarIs<Js::JavascriptProxy>(instance);
  if (bVar1) {
    this = UnsafeVarTo<Js::JavascriptProxy>(instance);
    if (this != (JavascriptProxy *)0x0) {
      pJVar2 = JavascriptProxy::PropertyKeysTrap(this,KeysKind,scriptContext);
      return pJVar2;
    }
  }
  pJVar2 = JavascriptObject::CreateOwnStringSymbolPropertiesHelper(object,scriptContext);
  return pJVar2;
}

Assistant:

JavascriptArray* JavascriptOperators::GetOwnPropertyKeys(Var instance, ScriptContext* scriptContext)
    {
        RecyclableObject *object = ToObject(instance, scriptContext);
        AssertOrFailFast(VarIsCorrectType(object));

        JavascriptProxy* proxy = JavascriptOperators::TryFromVar<JavascriptProxy>(instance);
        if (proxy)
        {
            return proxy->PropertyKeysTrap(JavascriptProxy::KeysTrapKind::KeysKind, scriptContext);
        }

        return JavascriptObject::CreateOwnStringSymbolPropertiesHelper(object, scriptContext);
    }